

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s,size_type n2)

{
  uint uVar1;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  substr(&local_28,(size_type)this,pos1);
  __n = local_28.size_;
  if (n2 < local_28.size_) {
    __n = n2;
  }
  uVar1 = memcmp(local_28.data_,s,__n);
  if ((uVar1 == 0) && (uVar1 = 0, local_28.size_ != n2)) {
    uVar1 = -(uint)(local_28.size_ < n2) | 1;
  }
  return uVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s, size_type n2 ) const // (6)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s, n2 ) );
    }